

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeRTASParallelOperationCreateExp
          (ze_driver_handle_t hDriver,ze_rtas_parallel_operation_exp_handle_t *phParallelOperation)

{
  object_t<_ze_rtas_parallel_operation_exp_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnRTASParallelOperationCreateExp_t pfnCreateExp;
  dditable_t *dditable;
  ze_rtas_parallel_operation_exp_handle_t *pp_Stack_20;
  ze_result_t result;
  ze_rtas_parallel_operation_exp_handle_t *phParallelOperation_local;
  ze_driver_handle_t hDriver_local;
  
  dditable._4_4_ = 0;
  pfnCreateExp = *(ze_pfnRTASParallelOperationCreateExp_t *)(hDriver + 8);
  if (*(code **)(pfnCreateExp + 0x68) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    phParallelOperation_local = *(ze_rtas_parallel_operation_exp_handle_t **)hDriver;
    pp_Stack_20 = phParallelOperation;
    dditable._4_4_ =
         (**(code **)(pfnCreateExp + 0x68))(phParallelOperation_local,phParallelOperation);
    hDriver_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t*>,_ze_rtas_parallel_operation_exp_handle_t*>
               ::getInstance<_ze_rtas_parallel_operation_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t*>,_ze_rtas_parallel_operation_exp_handle_t*>
                           *)(context + 0x6c0),pp_Stack_20,(dditable_t **)&pfnCreateExp);
      *pp_Stack_20 = (ze_rtas_parallel_operation_exp_handle_t)poVar1;
      hDriver_local._4_4_ = dditable._4_4_;
    }
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationCreateExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_parallel_operation_exp_handle_t* phParallelOperation///< [out] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnCreateExp = dditable->ze.RTASParallelOperationExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnCreateExp( hDriver, phParallelOperation );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_exp_handle_t>(
                context->ze_rtas_parallel_operation_exp_factory.getInstance( *phParallelOperation, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }